

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall
Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *na,Vector3f *nb,
                  Vector3f *nc,Material *m)

{
  Vector3f *local_70;
  Vector3f *local_50;
  Vector3f *nb_local;
  Vector3f *na_local;
  Vector3f *c_local;
  Vector3f *b_local;
  Vector3f *a_local;
  Triangle *this_local;
  
  Object3D::Object3D(&this->super_Object3D,m);
  (this->super_Object3D)._vptr_Object3D = (_func_int **)&PTR__Triangle_00170a78;
  local_50 = (Vector3f *)&this->field_0x30;
  do {
    Vector3f::Vector3f(local_50,0.0);
    local_50 = local_50 + 1;
  } while (local_50 != (Vector3f *)&this->field_0x54);
  local_70 = (Vector3f *)&this->field_0x54;
  do {
    Vector3f::Vector3f(local_70,0.0);
    local_70 = (Vector3f *)(local_70->m_elements + 3);
  } while ((Triangle *)local_70 != this + 1);
  Vector3f::operator=((Vector3f *)&this->field_0x30,a);
  Vector3f::operator=((Vector3f *)&this->field_0x3c,b);
  Vector3f::operator=((Vector3f *)&this->field_0x48,c);
  Vector3f::operator=((Vector3f *)&this->field_0x54,na);
  Vector3f::operator=((Vector3f *)&this->field_0x60,nb);
  Vector3f::operator=((Vector3f *)&this->field_0x6c,nc);
  return;
}

Assistant:

Triangle(const Vector3f &a,
             const Vector3f &b,
             const Vector3f &c,
             const Vector3f &na,
             const Vector3f &nb,
             const Vector3f &nc,
             Material *m) :
            Object3D(m) {
        _v[0] = a;
        _v[1] = b;
        _v[2] = c;
        _normals[0] = na;
        _normals[1] = nb;
        _normals[2] = nc;
    }